

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_catalog(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  FILE *pFVar25;
  xmlDocPtr pxVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  int n_value_1;
  undefined8 *puVar29;
  int n_value;
  uint uVar30;
  uint uVar31;
  undefined8 uVar32;
  int test_ret_11;
  ulong uVar33;
  int test_ret_4;
  int test_ret_3;
  int test_ret_14;
  uint uVar34;
  bool bVar35;
  int test_ret_1;
  int test_ret;
  int test_ret_2;
  int test_ret_5;
  int local_4c;
  uint local_48;
  uint local_40;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing catalog : 27 of 36 functions ...");
  }
  iVar1 = 0;
  uVar34 = 0;
  do {
    uVar33 = 0;
    do {
      uVar30 = 0;
      puVar29 = &DAT_00162d68;
      do {
        iVar2 = xmlMemBlocks();
        if (uVar34 < 4) {
          uVar32 = (&DAT_00162d68)[uVar34];
        }
        else {
          uVar32 = 0;
        }
        if ((uint)uVar33 < 4) {
          uVar28 = (&DAT_00162d68)[uVar33];
        }
        else {
          uVar28 = 0;
        }
        if (uVar30 < 4) {
          uVar27 = *puVar29;
        }
        else {
          uVar27 = 0;
        }
        xmlACatalogAdd(0,uVar32,uVar28,uVar27);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlACatalogAdd",(ulong)(uint)(iVar3 - iVar2));
          iVar1 = iVar1 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar34);
          printf(" %d",uVar33);
          printf(" %d");
          putchar(10);
        }
        uVar30 = uVar30 + 1;
        puVar29 = puVar29 + 1;
      } while (uVar30 != 5);
      uVar30 = (uint)uVar33 + 1;
      uVar33 = (ulong)uVar30;
    } while (uVar30 != 5);
    uVar34 = uVar34 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  uVar34 = 0;
  local_4c = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar34 == 0) {
      pFVar25 = fopen64("test.out","a+");
    }
    else {
      pFVar25 = (FILE *)0x0;
    }
    xmlACatalogDump(0,pFVar25);
    call_tests = call_tests + 1;
    if (pFVar25 != (FILE *)0x0) {
      fclose(pFVar25);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogDump",(ulong)(uint)(iVar3 - iVar2));
      local_4c = local_4c + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar34);
      putchar(10);
    }
    uVar34 = uVar34 + 1;
  } while (uVar34 == 1);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d68;
  uVar34 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar34 < 4) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    xmlACatalogRemove(0,uVar32);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogRemove",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar34 = 0;
  do {
    puVar29 = &DAT_00162d68;
    uVar30 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar34 < 4) {
        uVar32 = (&DAT_00162d68)[uVar34];
      }
      else {
        uVar32 = 0;
      }
      if (uVar30 < 4) {
        uVar28 = *puVar29;
      }
      else {
        uVar28 = 0;
      }
      lVar24 = xmlACatalogResolve(0,uVar32,uVar28);
      if (lVar24 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlACatalogResolve",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar34);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar30 != 5);
    uVar34 = uVar34 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d68;
  uVar34 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar34 < 4) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    lVar24 = xmlACatalogResolvePublic(0,uVar32);
    if (lVar24 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogResolvePublic",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d68;
  uVar34 = 0;
  local_34 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar34 < 4) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    lVar24 = xmlACatalogResolveSystem(0,uVar32);
    if (lVar24 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogResolveSystem",(ulong)(uint)(iVar6 - iVar5));
      local_34 = local_34 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d68;
  uVar34 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar34 < 4) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    lVar24 = xmlACatalogResolveURI(0,uVar32);
    if (lVar24 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlACatalogResolveURI",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar34 = 0;
  do {
    uVar30 = 0;
    do {
      uVar31 = 0;
      puVar29 = &DAT_00162d68;
      do {
        iVar7 = xmlMemBlocks();
        if (uVar34 < 4) {
          uVar32 = (&DAT_00162d68)[uVar34];
        }
        else {
          uVar32 = 0;
        }
        if (uVar30 < 4) {
          uVar28 = (&DAT_00162d68)[uVar30];
        }
        else {
          uVar28 = 0;
        }
        if (uVar31 < 4) {
          uVar27 = *puVar29;
        }
        else {
          uVar27 = 0;
        }
        xmlCatalogAdd(uVar32,uVar28,uVar27);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCatalogAdd",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar34);
          printf(" %d",(ulong)uVar30);
          printf(" %d");
          putchar(10);
        }
        uVar31 = uVar31 + 1;
        puVar29 = puVar29 + 1;
      } while (uVar31 != 5);
      uVar30 = uVar30 + 1;
    } while (uVar30 != 5);
    uVar34 = uVar34 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  xmlCatalogCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  xmlCatalogConvert();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  uVar34 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar34 == 0) {
      pFVar25 = fopen64("test.out","a+");
    }
    else {
      pFVar25 = (FILE *)0x0;
    }
    xmlCatalogDump(pFVar25);
    call_tests = call_tests + 1;
    if (pFVar25 != (FILE *)0x0) {
      fclose(pFVar25);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogDump",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",(ulong)uVar34);
      putchar(10);
    }
    uVar34 = uVar34 + 1;
  } while (uVar34 == 1);
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  xmlCatalogGetDefaults();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    iVar10 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCatalogGetDefaults",(ulong)(uint)(iVar10 - iVar8));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  xmlCatalogIsEmpty(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    iVar12 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCatalogIsEmpty",(ulong)(uint)(iVar12 - iVar10));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar34 = 0;
  do {
    uVar30 = 0;
    do {
      uVar31 = 0;
      puVar29 = &DAT_00162d68;
      do {
        iVar13 = xmlMemBlocks();
        if (uVar30 < 4) {
          uVar32 = (&DAT_00162d68)[uVar30];
        }
        else {
          uVar32 = 0;
        }
        if (uVar31 < 4) {
          uVar28 = *puVar29;
        }
        else {
          uVar28 = 0;
        }
        lVar24 = xmlCatalogLocalResolve(0,uVar32,uVar28);
        if (lVar24 != 0) {
          (*_xmlFree)();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar13 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCatalogLocalResolve",(ulong)(uint)(iVar14 - iVar13))
          ;
          iVar12 = iVar12 + 1;
          printf(" %d",(ulong)uVar34);
          printf(" %d",(ulong)uVar30);
          printf(" %d");
          putchar(10);
        }
        uVar31 = uVar31 + 1;
        puVar29 = puVar29 + 1;
      } while (uVar31 != 5);
      uVar30 = uVar30 + 1;
    } while (uVar30 != 5);
    bVar35 = uVar34 == 0;
    uVar34 = uVar34 + 1;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar34 = 0;
  do {
    puVar29 = &DAT_00162d68;
    uVar30 = 0;
    do {
      iVar14 = xmlMemBlocks();
      if (uVar30 < 4) {
        uVar32 = *puVar29;
      }
      else {
        uVar32 = 0;
      }
      lVar24 = xmlCatalogLocalResolveURI(0,uVar32);
      if (lVar24 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCatalogLocalResolveURI",(ulong)(uint)(iVar15 - iVar14)
              );
        iVar13 = iVar13 + 1;
        printf(" %d",(ulong)uVar34);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar30 != 5);
    bVar35 = uVar34 == 0;
    uVar34 = uVar34 + 1;
  } while (bVar35);
  function_tests = function_tests + 1;
  local_40 = (uint)(iVar10 != iVar11);
  uVar34 = 0;
  puVar29 = &DAT_00162d68;
  do {
    if (uVar34 < 4) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    xmlCatalogRemove(uVar32);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  uVar34 = 0;
  do {
    puVar29 = &DAT_00162d68;
    uVar30 = 0;
    do {
      if (uVar34 < 4) {
        uVar32 = (&DAT_00162d68)[uVar34];
      }
      else {
        uVar32 = 0;
      }
      if (uVar30 < 4) {
        uVar28 = *puVar29;
      }
      else {
        uVar28 = 0;
      }
      lVar24 = xmlCatalogResolve(uVar32,uVar28);
      if (lVar24 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      uVar30 = uVar30 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar30 != 5);
    uVar34 = uVar34 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d68;
  uVar34 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    if (uVar34 < 4) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    lVar24 = xmlCatalogResolvePublic(uVar32);
    if (lVar24 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar11 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolvePublic",(ulong)(uint)(iVar14 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",(ulong)uVar34);
      putchar(10);
    }
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d68;
  uVar34 = 0;
  iVar11 = 0;
  do {
    iVar14 = xmlMemBlocks();
    if (uVar34 < 4) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    lVar24 = xmlCatalogResolveSystem(uVar32);
    if (lVar24 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolveSystem",(ulong)(uint)(iVar15 - iVar14));
      iVar11 = iVar11 + 1;
      printf(" %d",(ulong)uVar34);
      putchar(10);
    }
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d68;
  uVar34 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    if (uVar34 < 4) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    lVar24 = xmlCatalogResolveURI(uVar32);
    if (lVar24 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogResolveURI",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",(ulong)uVar34);
      putchar(10);
    }
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 5);
  function_tests = function_tests + 1;
  uVar34 = 0;
  iVar15 = 0;
  do {
    iVar16 = xmlMemBlocks();
    xmlCatalogSetDefaultPrefer(uVar34 == 2);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogSetDefaultPrefer",(ulong)(uint)(iVar17 - iVar16))
      ;
      iVar15 = iVar15 + 1;
      printf(" %d",(ulong)uVar34);
      putchar(10);
    }
    uVar34 = uVar34 + 1;
  } while (uVar34 != 3);
  function_tests = function_tests + 1;
  uVar34 = 0xffffffff;
  iVar17 = 1;
  iVar16 = 0;
  do {
    uVar30 = 3;
    if (3 < uVar34) {
      uVar30 = uVar34;
    }
    uVar34 = uVar34 + 1;
    iVar18 = xmlMemBlocks();
    xmlCatalogSetDefaults(uVar30 + iVar17);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogSetDefaults",(ulong)(uint)(iVar19 - iVar18));
      iVar16 = iVar16 + 1;
      printf(" %d",(ulong)uVar34);
      putchar(10);
    }
    iVar17 = iVar17 + -1;
  } while (uVar34 != 3);
  function_tests = function_tests + 1;
  iVar17 = xmlMemBlocks();
  xmlConvertSGMLCatalog(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar18 = xmlMemBlocks();
  if (iVar17 != iVar18) {
    iVar19 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlConvertSGMLCatalog",(ulong)(uint)(iVar19 - iVar17));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar19 = xmlMemBlocks();
  xmlInitializeCatalog();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar19 != iVar20) {
    iVar21 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlInitializeCatalog",(ulong)(uint)(iVar21 - iVar19));
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar34 = 0;
  puVar29 = &DAT_00162d88;
  do {
    if (uVar34 < 7) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    xmlLoadCatalog(uVar32);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 8);
  function_tests = function_tests + 1;
  uVar34 = 0;
  puVar29 = &DAT_00162d50;
  do {
    if (uVar34 < 3) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    xmlLoadCatalogs(uVar32);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 4);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d88;
  uVar34 = 0;
  iVar21 = 0;
  do {
    iVar22 = xmlMemBlocks();
    if (uVar34 < 7) {
      uVar32 = *puVar29;
    }
    else {
      uVar32 = 0;
    }
    pxVar26 = (xmlDocPtr)xmlParseCatalogFile(uVar32);
    if (api_doc != pxVar26) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseCatalogFile",(ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      printf(" %d",(ulong)uVar34);
      putchar(10);
    }
    uVar34 = uVar34 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar34 != 8);
  local_48 = (uint)(iVar19 != iVar20);
  function_tests = function_tests + 1;
  uVar34 = local_4c + iVar1 + iVar2 + iVar3 + iVar4 + local_34 + iVar5 + iVar6 + iVar7 +
           (uint)(iVar8 != iVar9) + local_40 + iVar12 + iVar13 + iVar10 + iVar11 + iVar14 +
           iVar15 + iVar16 + (uint)(iVar17 != iVar18) + local_48 + iVar21;
  if (uVar34 != 0) {
    printf("Module catalog: %d errors\n",(ulong)uVar34);
  }
  return uVar34;
}

Assistant:

static int
test_catalog(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing catalog : 27 of 36 functions ...\n");
    test_ret += test_xmlACatalogAdd();
    test_ret += test_xmlACatalogDump();
    test_ret += test_xmlACatalogRemove();
    test_ret += test_xmlACatalogResolve();
    test_ret += test_xmlACatalogResolvePublic();
    test_ret += test_xmlACatalogResolveSystem();
    test_ret += test_xmlACatalogResolveURI();
    test_ret += test_xmlCatalogAdd();
    test_ret += test_xmlCatalogCleanup();
    test_ret += test_xmlCatalogConvert();
    test_ret += test_xmlCatalogDump();
    test_ret += test_xmlCatalogGetDefaults();
    test_ret += test_xmlCatalogIsEmpty();
    test_ret += test_xmlCatalogLocalResolve();
    test_ret += test_xmlCatalogLocalResolveURI();
    test_ret += test_xmlCatalogRemove();
    test_ret += test_xmlCatalogResolve();
    test_ret += test_xmlCatalogResolvePublic();
    test_ret += test_xmlCatalogResolveSystem();
    test_ret += test_xmlCatalogResolveURI();
    test_ret += test_xmlCatalogSetDefaultPrefer();
    test_ret += test_xmlCatalogSetDefaults();
    test_ret += test_xmlConvertSGMLCatalog();
    test_ret += test_xmlInitializeCatalog();
    test_ret += test_xmlLoadACatalog();
    test_ret += test_xmlLoadCatalog();
    test_ret += test_xmlLoadCatalogs();
    test_ret += test_xmlLoadSGMLSuperCatalog();
    test_ret += test_xmlNewCatalog();
    test_ret += test_xmlParseCatalogFile();

    if (test_ret != 0)
	printf("Module catalog: %d errors\n", test_ret);
    return(test_ret);
}